

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O2

void run_init_quads_task(parallel_task_1d *task,size_t thread_id)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  real_t rVar4;
  work_item *pwVar5;
  long lVar6;
  ulong uVar7;
  work_item *pwVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  real_t *prVar14;
  ulong uVar15;
  size_t sVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vec3 vVar26;
  vec3 b;
  
  pwVar5 = task[1].work_item.next;
  lVar6 = *(long *)(pwVar5[1].work_fn + 8);
  sVar16 = (task->range).begin;
  uVar7 = (task->range).end;
  uVar15 = sVar16 << 5 | 0x18;
  prVar14 = (real_t *)(task[1].work_item.work_fn + sVar16 * 0x48 + 0x44);
  for (; sVar16 < uVar7; sVar16 = sVar16 + 1) {
    pwVar8 = pwVar5->next;
    lVar13 = *(long *)((long)pwVar8 + (uVar15 - 0x18)) * 0xc;
    lVar11 = *(long *)((long)&pwVar8[-1].work_fn + uVar15) * 0xc;
    lVar12 = *(long *)((long)pwVar8 + (uVar15 - 8)) * 0xc;
    lVar10 = *(long *)((long)&pwVar8->work_fn + uVar15) * 0xc;
    fVar17 = (float)*(undefined8 *)(lVar6 + lVar13);
    fVar23 = (float)((ulong)*(undefined8 *)(lVar6 + lVar13) >> 0x20);
    fVar18 = *(float *)(lVar6 + 8 + lVar13);
    uVar3 = *(undefined8 *)(lVar6 + lVar11);
    fVar24 = (float)uVar3;
    fVar25 = (float)((ulong)uVar3 >> 0x20);
    fVar1 = *(float *)(lVar6 + 8 + lVar11);
    uVar3 = *(undefined8 *)(lVar6 + lVar12);
    fVar19 = (float)uVar3;
    fVar20 = (float)((ulong)uVar3 >> 0x20);
    fVar2 = *(float *)(lVar6 + 8 + lVar12);
    fVar21 = fVar19 - fVar17;
    fVar22 = fVar20 - fVar23;
    vVar26._[0] = fVar17 - fVar24;
    vVar26._[1] = fVar23 - fVar25;
    uVar9 = CONCAT44(vVar26._[1],vVar26._[0]);
    fVar23 = fVar2 - fVar18;
    fVar18 = fVar18 - fVar1;
    uVar3 = *(undefined8 *)(lVar6 + lVar10);
    fVar17 = *(float *)(lVar6 + 8 + lVar10);
    b._[1] = fVar22;
    b._[0] = fVar21;
    vVar26._[2] = fVar18;
    b._[2] = fVar23;
    vVar26 = cross_vec3(vVar26,b);
    rVar4 = *(real_t *)(lVar6 + 8 + lVar13);
    *(undefined8 *)(prVar14 + -0x11) = *(undefined8 *)(lVar6 + lVar13);
    prVar14[-0xf] = rVar4;
    *(undefined8 *)(prVar14 + -0xe) = uVar9;
    prVar14[-0xc] = fVar18;
    *(ulong *)(prVar14 + -0xb) = CONCAT44(fVar22,fVar21);
    prVar14[-9] = fVar23;
    *(ulong *)(prVar14 + -8) =
         CONCAT44(fVar20 - (float)((ulong)uVar3 >> 0x20),fVar19 - (float)uVar3);
    prVar14[-6] = fVar2 - fVar17;
    *(ulong *)(prVar14 + -5) = CONCAT44(fVar25 - fVar20,fVar24 - fVar19);
    prVar14[-3] = fVar1 - fVar2;
    *(long *)(prVar14 + -2) = vVar26._._0_8_;
    *prVar14 = vVar26._[2];
    uVar15 = uVar15 + 0x20;
    prVar14 = prVar14 + 0x12;
  }
  return;
}

Assistant:

static void run_init_quads_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct init_primitives_task* init_primitives_task = (void*)task;
    struct quad* quads = init_primitives_task->primitives;
    const struct mesh* mesh = init_primitives_task->mesh;
    const struct vec3* vertices = mesh->attrs[ATTR_POSITION].data;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct vec3* v0 = &vertices[mesh->indices[i * 4 + 0]];
        const struct vec3* v1 = &vertices[mesh->indices[i * 4 + 1]];
        const struct vec3* v2 = &vertices[mesh->indices[i * 4 + 2]];
        const struct vec3* v3 = &vertices[mesh->indices[i * 4 + 3]];
        quads[i] = make_quad(v0, v1, v2, v3);
    }
}